

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# was_added.c
# Opt level: O1

int was_added(pair_t **l,uint32 src)

{
  bool bVar1;
  pair_t *ppVar2;
  pair_t *c;
  int iVar3;
  bool bVar4;
  
  ppVar2 = *l;
  iVar3 = 0;
  if (ppVar2 == (pair_t *)0x0) {
    bVar1 = true;
    iVar3 = 0;
  }
  else {
    do {
      bVar4 = ppVar2->src_id == src;
      bVar1 = !bVar4;
      if (bVar4) {
        iVar3 = 1;
        break;
      }
      ppVar2 = ppVar2->next;
    } while (ppVar2 != (pair_str *)0x0);
  }
  if (bVar1) {
    ppVar2 = (pair_t *)
             __ckd_calloc__(1,0x10,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/was_added.c"
                            ,0xa7);
    ppVar2->src_id = src;
    ppVar2->next = *l;
    *l = ppVar2;
  }
  return iVar3;
}

Assistant:

int
was_added(pair_t **l,
	  uint32 src)
{
    pair_t *new;
    int ret;

    /* see if given src has been added to the destination yet or not */
    ret = find_added(*l, src);

    if (ret == FALSE) {
	/* it hasn't, so prepend an entry for it on the list */

	new = (pair_t *)ckd_calloc(1, sizeof(pair_t));

	new->src_id = src;
    
	new->next = *l;
	*l = new;
    }

    return ret;
}